

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

bool google::protobuf::safe_uint_internal<unsigned_int>(string *text,uint *value_p)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  pointer pcVar4;
  byte *pbVar5;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  bool bVar9;
  byte *local_70;
  long local_68;
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  *value_p = 0;
  pcVar6 = (text->_M_dataplus)._M_p;
  pcVar1 = pcVar6 + text->_M_string_length;
  if (0 < (long)text->_M_string_length) {
    do {
      if (*pcVar6 != ' ') break;
      pcVar6 = pcVar6 + 1;
    } while (pcVar6 < pcVar1);
  }
  do {
    pcVar7 = pcVar1;
    if (pcVar7 <= pcVar6) goto LAB_005e268c;
    pcVar1 = pcVar7 + -1;
  } while (pcVar7[-1] == ' ');
  cVar2 = *pcVar6;
  if (((cVar2 == '-') || (cVar2 == '+')) && (pcVar7 <= pcVar6 + 1)) {
LAB_005e268c:
    bVar9 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)local_50,(ulong)text);
    std::__cxx11::string::operator=((string *)text,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    uVar8 = 0;
    bVar9 = false;
    if (cVar2 != '-') {
      pcVar4 = (text->_M_dataplus)._M_p;
      local_70 = (byte *)local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar4,pcVar4 + text->_M_string_length);
      bVar9 = true;
      if (0 < local_68) {
        uVar8 = 0;
        pbVar5 = local_70;
        do {
          bVar3 = *pbVar5;
          if ((byte)(bVar3 - 0x3a) < 0xf6) {
            bVar9 = false;
            break;
          }
          if ((0x19999999 < uVar8) || (0x2f - bVar3 < uVar8 * 10)) {
            bVar9 = false;
            uVar8 = 0xffffffff;
            break;
          }
          uVar8 = (uVar8 * 10 + (uint)bVar3) - 0x30;
          pbVar5 = pbVar5 + 1;
        } while (pbVar5 < local_70 + local_68);
      }
      *value_p = uVar8;
      if (local_70 != (byte *)local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
    }
  }
  return bVar9;
}

Assistant:

bool safe_uint_internal(string text, IntType* value_p) {
  *value_p = 0;
  bool negative;
  if (!safe_parse_sign(&text, &negative) || negative) {
    return false;
  }
  return safe_parse_positive_int(text, value_p);
}